

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool __thiscall groundupdb::HashedValue::operator==(HashedValue *this,HashedValue *other)

{
  byte *pbVar1;
  byte *pbVar2;
  pointer pbVar3;
  
  if ((this->m_hash == other->m_hash) && (this->m_length == other->m_length)) {
    pbVar2 = (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar1 = (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pbVar3 = (other->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)pbVar1 - (long)pbVar2 ==
        (long)(other->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pbVar3) {
      if (pbVar2 == pbVar1) {
        return pbVar2 == pbVar1;
      }
      if (*pbVar2 == *pbVar3) {
        do {
          pbVar3 = pbVar3 + 1;
          pbVar2 = pbVar2 + 1;
          if (pbVar2 == pbVar1) {
            return pbVar2 == pbVar1;
          }
        } while (*pbVar2 == *pbVar3);
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool
HashedValue::operator==(const HashedValue& other) const
{
  if (m_hash != other.m_hash) {
    return false;
  }
  // compare hash first as generally it will be faster most often
  if (m_length != other.m_length) {
    return false;
  }
  // only do a data wise comparison if you must (highly, highly unlikely - requires hash collision)
  //return 0 == std::strcmp(m_data,other.m_data);
  return m_data == other.m_data;
}